

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_playback(Pager *pPager,int isHot)

{
  sqlite3_vfs *psVar1;
  _func_int_sqlite3_vfs_ptr_char_ptr_int *p_Var2;
  u64 n;
  bool bVar3;
  u32 uVar4;
  char *__s1;
  int iVar5;
  int iVar6;
  int iVar7;
  sqlite3_file *psVar8;
  sqlite3_file *psVar9;
  undefined4 *p;
  size_t sVar10;
  long lVar11;
  char *__s;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  u32 nRec;
  int res;
  Pgno mxPg;
  i64 szJ;
  i64 nSuperJournal;
  u32 savedPageSize;
  u32 local_98;
  int local_94;
  undefined8 local_90;
  int local_88;
  u32 local_84;
  sqlite3_vfs *local_80;
  sqlite3_file *local_78;
  i64 local_70;
  char *local_68;
  undefined4 *local_60;
  char *local_58;
  char *local_50;
  u32 local_48;
  int local_44;
  long local_40;
  sqlite3_file *local_38;
  
  psVar1 = pPager->pVfs;
  local_84 = 0;
  local_88 = 1;
  local_48 = (u32)pPager->pageSize;
  iVar5 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&local_70);
  uVar14 = 0;
  if (iVar5 == 0) {
    pcVar12 = pPager->pTmpSpace;
    iVar5 = readSuperJournal(pPager->jfd,pcVar12,pPager->pVfs->mxPathname + 1);
    if (iVar5 == 0) {
      if (*pcVar12 == '\0') {
        iVar5 = 0;
      }
      else {
        iVar5 = (*psVar1->xAccess)(psVar1,pcVar12,0,&local_88);
      }
    }
    if ((iVar5 == 0) && (local_88 != 0)) {
      pPager->journalOff = 0;
      iVar7 = readJournalHdr(pPager,isHot,local_70,&local_98,&local_84);
      if (iVar7 == 0) {
        uVar14 = 0;
        local_90 = CONCAT44(local_90._4_4_,isHot);
        local_94 = isHot;
        do {
          uVar4 = local_84;
          if (local_98 == 0xffffffff) {
            local_98 = (u32)((long)(local_70 - (ulong)pPager->sectorSize) / (pPager->pageSize + 8));
          }
          if ((local_98 == 0 && isHot == 0) &&
             ((ulong)pPager->sectorSize + pPager->journalHdr == pPager->journalOff)) {
            local_98 = (u32)((local_70 - pPager->journalOff) / (pPager->pageSize + 8));
          }
          if (pPager->journalOff == (ulong)pPager->sectorSize) {
            iVar5 = pager_truncate(pPager,local_84);
            if (iVar5 != 0) goto LAB_0014d5da;
            pPager->dbSize = uVar4;
            if (pPager->mxPgno < uVar4) {
              pPager->mxPgno = uVar4;
            }
          }
          if (local_98 != 0) {
            iVar7 = (int)uVar14;
            local_80 = (sqlite3_vfs *)CONCAT44(local_80._4_4_,iVar7 + local_98);
            bVar16 = (int)local_90 == 0;
            iVar5 = -local_98;
            iVar13 = 0;
            do {
              if (!bVar16) {
                pager_reset(pPager);
              }
              iVar6 = pager_playback_one_page(pPager,&pPager->journalOff,(Bitvec *)0x0,1,0);
              if (iVar6 != 0) {
                if (iVar6 == 0x65) {
                  pPager->journalOff = local_70;
                  uVar14 = (ulong)(uint)(iVar7 - iVar13);
                  local_90 = (ulong)local_90._4_4_ << 0x20;
                  goto LAB_0014d931;
                }
                iVar5 = 0;
                if (iVar6 != 0x20a) {
                  iVar5 = iVar6;
                }
                uVar14 = (ulong)(uint)(iVar7 - iVar13);
                isHot = local_94;
                goto LAB_0014d5da;
              }
              iVar13 = iVar13 + -1;
              bVar16 = true;
            } while (iVar5 != iVar13);
            local_90 = (ulong)local_90._4_4_ << 0x20;
            uVar14 = (ulong)local_80 & 0xffffffff;
          }
LAB_0014d931:
          isHot = local_94;
          iVar7 = readJournalHdr(pPager,local_94,local_70,&local_98,&local_84);
        } while (iVar7 == 0);
      }
      else {
        uVar14 = 0;
      }
      iVar5 = 0;
      if (iVar7 != 0x65) {
        iVar5 = iVar7;
      }
    }
  }
LAB_0014d5da:
  if (iVar5 == 0) {
    iVar5 = sqlite3PagerSetPagesize(pPager,&local_48,-1);
  }
  pPager->changeCountDone = pPager->tempFile;
  if (iVar5 == 0) {
    pcVar12 = pPager->pTmpSpace + 4;
    iVar5 = readSuperJournal(pPager->jfd,pcVar12,pPager->pVfs->mxPathname + 1);
  }
  else {
    pcVar12 = (char *)0x0;
  }
  if ((iVar5 == 0) && (iVar5 = 0, (byte)(pPager->eState - 4) < 0xfd)) {
    iVar5 = sqlite3PagerSync(pPager,(char *)0x0);
  }
  if (iVar5 == 0) {
    iVar5 = pager_end_transaction(pPager,(uint)(*pcVar12 != '\0'),0);
  }
  if (((iVar5 == 0) && (iVar5 = 0, *pcVar12 != '\0')) && (local_88 != 0)) {
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    psVar1 = pPager->pVfs;
    n = (long)psVar1->szOsFile * 2;
    local_90 = uVar14;
    psVar8 = (sqlite3_file *)sqlite3Malloc(n);
    local_80 = psVar1;
    if (psVar8 == (sqlite3_file *)0x0) {
      iVar5 = 7;
      psVar9 = (sqlite3_file *)0x0;
    }
    else {
      memset(psVar8,0,n);
      iVar5 = (*psVar1->xOpen)(psVar1,pcVar12,psVar8,0x4001,(int *)0x0);
      psVar9 = (sqlite3_file *)((long)&psVar8->pMethods + (long)psVar1->szOsFile);
    }
    uVar14 = local_90;
    if ((iVar5 == 0) &&
       (local_38 = psVar9, iVar5 = (*psVar8->pMethods->xFileSize)(psVar8,(sqlite3_int64 *)&local_68)
       , iVar5 == 0)) {
      iVar5 = local_80->mxPathname;
      local_78 = psVar8;
      p = (undefined4 *)sqlite3Malloc((u64)(local_68 + (long)iVar5 + 7));
      if (p == (undefined4 *)0x0) {
        iVar5 = 7;
        p = (undefined4 *)0x0;
        psVar8 = local_78;
        uVar14 = local_90;
      }
      else {
        __s = (char *)(p + 1);
        *p = 0;
        local_50 = local_68;
        local_40 = (long)iVar5;
        iVar5 = (*local_78->pMethods->xRead)(local_78,__s,(int)local_68,0);
        psVar8 = local_78;
        uVar14 = local_90;
        if (iVar5 == 0) {
          local_40 = local_40 + 1;
          local_50 = local_50 + (long)p + 6;
          __s[(long)local_68] = '\0';
          local_68[(long)p + 5] = '\0';
          pcVar15 = __s;
          local_94 = isHot;
          local_60 = p;
          local_58 = __s;
          do {
            psVar8 = local_78;
            psVar1 = local_80;
            if ((long)local_68 <= (long)__s - (long)pcVar15) {
              if (local_78->pMethods != (sqlite3_io_methods *)0x0) {
                (*local_78->pMethods->xClose)(local_78);
                psVar8->pMethods = (sqlite3_io_methods *)0x0;
              }
              uVar14 = local_90;
              p_Var2 = psVar1->xDelete;
              if (p_Var2 == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                iVar5 = 0;
                p = local_60;
              }
              else {
                iVar5 = (*p_Var2)(psVar1,pcVar12,0);
                p = local_60;
              }
              goto LAB_0014d793;
            }
            iVar5 = (*local_80->xAccess)(local_80,__s,0,&local_44);
            psVar8 = local_38;
            if (iVar5 == 0) {
              if (local_44 == 0) {
                iVar5 = 0;
              }
              else {
                bVar3 = false;
                iVar5 = (*local_80->xOpen)(local_80,__s,local_38,0x4001,(int *)0x0);
                __s1 = local_50;
                bVar16 = true;
                pcVar15 = local_58;
                if (iVar5 == 0) {
                  iVar5 = readSuperJournal(psVar8,local_50,(u32)local_40);
                  if (psVar8->pMethods != (sqlite3_io_methods *)0x0) {
                    (*psVar8->pMethods->xClose)(psVar8);
                    psVar8->pMethods = (sqlite3_io_methods *)0x0;
                  }
                  pcVar15 = local_58;
                  if (iVar5 == 0) {
                    iVar5 = 0;
                    if (*__s1 == '\0') {
                      bVar16 = false;
                    }
                    else {
                      iVar7 = strcmp(__s1,pcVar12);
                      bVar16 = iVar7 == 0;
                    }
                    bVar3 = (bool)(bVar16 ^ 1);
                  }
                  else {
                    bVar3 = false;
                    bVar16 = true;
                  }
                }
                isHot = local_94;
                if (!bVar3) goto LAB_0014db04;
              }
              if (__s == (char *)0x0) {
                lVar11 = 1;
              }
              else {
                sVar10 = strlen(__s);
                lVar11 = (ulong)((uint)sVar10 & 0x3fffffff) + 1;
              }
              __s = __s + lVar11;
              bVar16 = false;
            }
            else {
              bVar16 = true;
            }
LAB_0014db04:
          } while (!bVar16);
          p = local_60;
          psVar8 = local_78;
          uVar14 = local_90;
          if (!bVar16) goto LAB_0014d6b1;
        }
      }
    }
    else {
      p = (undefined4 *)0x0;
    }
LAB_0014d793:
    sqlite3_free(p);
    if (psVar8 != (sqlite3_file *)0x0) {
      if (psVar8->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar8->pMethods->xClose)(psVar8);
        psVar8->pMethods = (sqlite3_io_methods *)0x0;
      }
      sqlite3_free(psVar8);
    }
  }
LAB_0014d6b1:
  if ((isHot != 0) && ((int)uVar14 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",uVar14 & 0xffffffff,pPager->zJournal);
  }
  setSectorSize(pPager);
  return iVar5;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zSuper = 0;        /* Name of super-journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the super-journal name from the journal, if it is present.
  ** If a super-journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zSuper = pPager->pTmpSpace;
  rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zSuper[0] ){
    rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
  }
  zSuper = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error
  ** occurs.
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
      if( pPager->mxPgno<mxPg ){
        pPager->mxPgno = mxPg;
      }
    }

    /* Copy original pages out of the journal and back into the
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or
  ** malloc error that occurred after the change-counter was updated but
  ** before the transaction was committed, then the change-counter
  ** modification may just have been reverted. If this happens in exclusive
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    /* Leave 4 bytes of space before the super-journal filename in memory.
    ** This is because it may end up being passed to sqlite3OsOpen(), in
    ** which case it requires 4 0x00 bytes in memory immediately before
    ** the filename. */
    zSuper = &pPager->pTmpSpace[4];
    rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zSuper[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zSuper[0] && res ){
    /* If there was a super-journal and this routine will return success,
    ** see if it is possible to delete the super-journal.
    */
    assert( zSuper==&pPager->pTmpSpace[4] );
    memset(&zSuper[-4], 0, 4);
    rc = pager_delsuper(pPager, zSuper);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}